

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O1

void duckdb::HandleCollations
               (ClientContext *context,ScalarFunction *bound_function,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *children)

{
  FunctionCollationHandling FVar1;
  InternalException *this;
  string local_40;
  
  FVar1 = (bound_function->super_BaseScalarFunction).collation_handling;
  if (FVar1 == IGNORE_COLLATIONS) {
    return;
  }
  if (FVar1 != PUSH_COMBINABLE_COLLATIONS) {
    if (FVar1 == PROPAGATE_COLLATIONS) {
      PropagateCollations(context,bound_function,children);
      return;
    }
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unrecognized collation handling","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  PushCollations(context,bound_function,children,COMBINABLE_COLLATIONS);
  return;
}

Assistant:

void HandleCollations(ClientContext &context, ScalarFunction &bound_function,
                      vector<unique_ptr<Expression>> &children) {
	switch (bound_function.collation_handling) {
	case FunctionCollationHandling::IGNORE_COLLATIONS:
		// explicitly ignoring collation handling
		break;
	case FunctionCollationHandling::PROPAGATE_COLLATIONS:
		PropagateCollations(context, bound_function, children);
		break;
	case FunctionCollationHandling::PUSH_COMBINABLE_COLLATIONS:
		// first propagate, then push collations to the children
		PushCollations(context, bound_function, children, CollationType::COMBINABLE_COLLATIONS);
		break;
	default:
		throw InternalException("Unrecognized collation handling");
	}
}